

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::downresU(PtexSeparableKernel *this)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  
  pfVar2 = this->ku;
  uVar1 = this->u;
  uVar3 = uVar1 & 1;
  uVar5 = this->uw - uVar3;
  pfVar6 = pfVar2 + uVar3;
  pfVar7 = pfVar6;
  for (uVar4 = (long)(int)uVar5 / 2 & 0xffffffff; 0 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
    *pfVar6 = *pfVar7 + pfVar7[1];
    pfVar6 = pfVar6 + 1;
    pfVar7 = pfVar7 + 2;
  }
  if ((uVar5 & 1) != 0) {
    *pfVar6 = *pfVar7;
    pfVar6 = pfVar6 + 1;
  }
  this->u = (int)uVar1 / 2;
  this->uw = (int)((ulong)((long)pfVar6 - (long)pfVar2) >> 2);
  (this->res).ulog2 = (this->res).ulog2 + -1;
  return;
}

Assistant:

void downresU()
    {
        float* src = ku;
        float* dst = ku;

        // skip odd leading sample (if any)
        if (u & 1) {
            dst++;
            src++;
            uw--;
        }

        // combine even pairs
        for (int i = uw/2; i > 0; i--) {
            *dst++ = src[0] + src[1];
            src += 2;
        }

        // copy odd trailing sample (if any)
        if (uw & 1) {
            *dst++ = *src++;
        }

        // update state
        u /= 2;
        uw = int(dst - ku);
        res.ulog2--;
    }